

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<kj::(anonymous_namespace)::SocketAddress>::setCapacity
          (Vector<kj::(anonymous_namespace)::SocketAddress> *this,size_t newSize)

{
  SocketAddress *pSVar1;
  RemoveConst<kj::(anonymous_namespace)::SocketAddress> *pRVar2;
  SocketAddress *pSVar3;
  ArrayDisposer *pAVar4;
  SocketAddress *__dest;
  ulong uVar5;
  SocketAddress *pSVar6;
  size_t __n;
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> newBuilder;
  SocketAddress *pSVar7;
  SocketAddress *pSVar8;
  undefined8 *puVar9;
  
  pSVar1 = (this->builder).ptr;
  uVar5 = ((long)(this->builder).pos - (long)pSVar1 >> 3) * -0xf0f0f0f0f0f0f0f;
  if (newSize <= uVar5 && uVar5 - newSize != 0) {
    (this->builder).pos = pSVar1 + newSize;
  }
  __dest = (SocketAddress *)
           _::HeapArrayDisposer::allocateImpl
                     (0x88,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar6 = __dest + newSize;
  puVar9 = &_::HeapArrayDisposer::instance;
  pSVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pSVar1;
  pSVar7 = __dest;
  pSVar8 = pSVar6;
  if (__n != 0) {
    memcpy(__dest,pSVar1,__n);
  }
  pSVar1 = (this->builder).ptr;
  if (pSVar1 != (SocketAddress *)0x0) {
    pRVar2 = (this->builder).pos;
    pSVar3 = (this->builder).endPtr;
    (this->builder).ptr = (SocketAddress *)0x0;
    (this->builder).pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
    (this->builder).endPtr = (SocketAddress *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pSVar1,0x88,((long)pRVar2 - (long)pSVar1 >> 3) * -0xf0f0f0f0f0f0f0f,
               ((long)pSVar3 - (long)pSVar1 >> 3) * -0xf0f0f0f0f0f0f0f,0,pSVar7,
               (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)((long)__dest + __n),pSVar8,
               puVar9);
  }
  (this->builder).ptr = __dest;
  (this->builder).pos =
       (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)((long)__dest + __n);
  (this->builder).endPtr = pSVar6;
  (this->builder).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }